

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperCreate.c
# Opt level: O0

void Map_TableResize(Map_Man_t *pMan)

{
  int TableSize;
  uint uVar1;
  Map_Node_t **__s;
  Map_Node_t *local_58;
  Map_Node_t *local_50;
  uint Key;
  abctime clk;
  int local_30;
  int i;
  int Counter;
  int nBinsNew;
  Map_Node_t *pEnt2;
  Map_Node_t *pEnt;
  Map_Node_t **pBinsNew;
  Map_Man_t *pMan_local;
  
  Abc_Clock();
  TableSize = Abc_PrimeCudd(pMan->nBins << 1);
  __s = (Map_Node_t **)malloc((long)TableSize << 3);
  memset(__s,0,(long)TableSize << 3);
  local_30 = 0;
  for (clk._4_4_ = 0; clk._4_4_ < pMan->nBins; clk._4_4_ = clk._4_4_ + 1) {
    pEnt2 = pMan->pBins[clk._4_4_];
    if (pEnt2 == (Map_Node_t *)0x0) {
      local_50 = (Map_Node_t *)0x0;
    }
    else {
      local_50 = pEnt2->pNext;
    }
    _Counter = local_50;
    while (pEnt2 != (Map_Node_t *)0x0) {
      uVar1 = Map_HashKey2(pEnt2->p1,pEnt2->p2,TableSize);
      pEnt2->pNext = __s[uVar1];
      __s[uVar1] = pEnt2;
      local_30 = local_30 + 1;
      pEnt2 = _Counter;
      if (_Counter == (Map_Node_t *)0x0) {
        local_58 = (Map_Node_t *)0x0;
      }
      else {
        local_58 = _Counter->pNext;
      }
      _Counter = local_58;
    }
  }
  if (local_30 == pMan->nNodes - pMan->nInputs) {
    if (pMan->pBins != (Map_Node_t **)0x0) {
      free(pMan->pBins);
      pMan->pBins = (Map_Node_t **)0x0;
    }
    pMan->pBins = __s;
    pMan->nBins = TableSize;
    return;
  }
  __assert_fail("Counter == pMan->nNodes - pMan->nInputs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mapper/mapperCreate.c"
                ,0x210,"void Map_TableResize(Map_Man_t *)");
}

Assistant:

void Map_TableResize( Map_Man_t * pMan )
{
    Map_Node_t ** pBinsNew;
    Map_Node_t * pEnt, * pEnt2;
    int nBinsNew, Counter, i;
    abctime clk;
    unsigned Key;

clk = Abc_Clock();
    // get the new table size
    nBinsNew = Abc_PrimeCudd(2 * pMan->nBins); 
    // allocate a new array
    pBinsNew = ABC_ALLOC( Map_Node_t *, nBinsNew );
    memset( pBinsNew, 0, sizeof(Map_Node_t *) * nBinsNew );
    // rehash the entries from the old table
    Counter = 0;
    for ( i = 0; i < pMan->nBins; i++ )
        for ( pEnt = pMan->pBins[i], pEnt2 = pEnt? pEnt->pNext: NULL; pEnt; 
              pEnt = pEnt2, pEnt2 = pEnt? pEnt->pNext: NULL )
        {
            Key = Map_HashKey2( pEnt->p1, pEnt->p2, nBinsNew );
            pEnt->pNext = pBinsNew[Key];
            pBinsNew[Key] = pEnt;
            Counter++;
        }
    assert( Counter == pMan->nNodes - pMan->nInputs );
    if ( pMan->fVerbose )
    {
//        printf( "Increasing the unique table size from %6d to %6d. ", pMan->nBins, nBinsNew );
//        ABC_PRT( "Time", Abc_Clock() - clk );
    }
    // replace the table and the parameters
    ABC_FREE( pMan->pBins );
    pMan->pBins = pBinsNew;
    pMan->nBins = nBinsNew;
}